

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O0

string * __thiscall TileGate::toString_abi_cxx11_(TileGate *this)

{
  const_reference pvVar1;
  long in_RSI;
  string *in_RDI;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&GATE_SYMBOL_TABLE_abi_cxx11_,
                        (long)(*(int *)(in_RSI + 0x24) * 0xc + *(int *)(in_RSI + 8) * 3 +
                               *(int *)(in_RSI + 0x28) + -1));
  std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  return in_RDI;
}

Assistant:

string TileGate::toString() const {
    return GATE_SYMBOL_TABLE[_type * 12 + _direction * 3 + _state - 1];
}